

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O1

int lj_debug_getinfo(lua_State *L,char *what,lj_Debug *ar,int ext)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  BCLine BVar6;
  uint uVar7;
  char *pcVar8;
  GCtab *t;
  TValue *pTVar9;
  uint32_t uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  char cVar14;
  cTValue *frame;
  ulong uVar15;
  cTValue *nextframe;
  GCfunc *unaff_R15;
  
  if (*what == '>') {
    pTVar9 = L->top;
    iVar2 = *(int *)((long)pTVar9 + -4);
    if (iVar2 == -9) {
      unaff_R15 = (GCfunc *)(ulong)pTVar9[-1].u32.lo;
      L->top = pTVar9 + -1;
      what = what + 1;
    }
    nextframe = (cTValue *)0x0;
    if (iVar2 != -9) {
      return 0;
    }
    frame = (cTValue *)0x0;
  }
  else {
    uVar11 = ar->i_ci;
    frame = (cTValue *)((ulong)(L->stack).ptr32 + (ulong)(uVar11 & 0xffff) * 8);
    nextframe = (cTValue *)0x0;
    if (0xffff < uVar11) {
      nextframe = frame + (uVar11 >> 0x10);
    }
    unaff_R15 = (GCfunc *)(ulong)(frame->u32).lo;
  }
  bVar5 = false;
  bVar4 = false;
  do {
    bVar1 = *what;
    if (bVar1 < 0x6c) {
      if (bVar1 < 0x53) {
        if (bVar1 != 0x4c) {
          if (bVar1 != 0) {
            return 0;
          }
          if (bVar4) {
            pTVar9 = L->top;
            (pTVar9->u32).lo = (uint32_t)unaff_R15;
            (pTVar9->field_2).it = 0xfffffff7;
            pTVar9 = L->top;
            L->top = pTVar9 + 1;
            if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar9 + 1) {
              lj_state_growstack1(L);
            }
          }
          if (bVar5) {
            if ((unaff_R15->c).ffid == '\0') {
              t = lj_tab_new(L,0,0);
              uVar15 = (ulong)(unaff_R15->c).pc.ptr32;
              uVar13 = (ulong)*(uint *)(uVar15 - 0xc);
              if (uVar13 != 0) {
                cVar14 = '\x01';
                if (0xff < *(int *)(uVar15 - 0x10)) {
                  cVar14 = (0xffff < *(int *)(uVar15 - 0x10)) * '\x02' + '\x02';
                }
                uVar11 = *(int *)(uVar15 - 0x38) - 1;
                if (uVar11 != 0) {
                  iVar2 = *(int *)(uVar15 - 0x14);
                  uVar15 = 0;
                  do {
                    if (cVar14 == '\x02') {
                      uVar7 = (uint)*(ushort *)(uVar13 + uVar15 * 2);
                    }
                    else if (cVar14 == '\x01') {
                      uVar7 = (uint)*(byte *)(uVar13 + uVar15);
                    }
                    else {
                      uVar7 = *(uint *)(uVar13 + uVar15 * 4);
                    }
                    lVar12 = (long)(int)uVar7 + (long)iVar2;
                    uVar7 = (uint)lVar12;
                    if (uVar7 < t->asize) {
                      pTVar9 = (TValue *)((ulong)(t->array).ptr32 + lVar12 * 8);
                    }
                    else {
                      pTVar9 = lj_tab_setinth(L,t,uVar7);
                    }
                    (pTVar9->field_2).it = 0xfffffffd;
                    uVar15 = uVar15 + 1;
                  } while (uVar11 != uVar15);
                }
              }
              pTVar9 = L->top;
              (pTVar9->u32).lo = (uint32_t)t;
              uVar10 = 0xfffffff4;
            }
            else {
              pTVar9 = L->top;
              uVar10 = 0xffffffff;
            }
            (pTVar9->field_2).it = uVar10;
            pTVar9 = L->top;
            L->top = pTVar9 + 1;
            if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar9 + 1) {
              lj_state_growstack1(L);
              return 1;
            }
            return 1;
          }
          return 1;
        }
        bVar5 = true;
      }
      else if (bVar1 == 0x53) {
        if ((unaff_R15->c).ffid == '\0') {
          uVar15 = (ulong)(unaff_R15->c).pc.ptr32;
          uVar11 = *(uint *)(uVar15 - 0x18);
          iVar2 = *(int *)(uVar15 - 0x14);
          ar->source = (char *)((GCstr *)(ulong)uVar11 + 1);
          lj_debug_shortname(ar->short_src,(GCstr *)(ulong)uVar11,iVar2);
          ar->linedefined = iVar2;
          iVar3 = *(int *)(uVar15 - 0x10);
          ar->lastlinedefined = iVar3 + iVar2;
          pcVar8 = "main";
          if (iVar3 == 0) {
            pcVar8 = "Lua";
          }
          if (iVar2 != 0) {
            pcVar8 = "Lua";
          }
        }
        else {
          ar->source = "=[C]";
          builtin_strncpy(ar->short_src,"[C]",4);
          ar->linedefined = -1;
          ar->lastlinedefined = -1;
          pcVar8 = "C";
        }
        ar->what = pcVar8;
      }
      else {
        bVar4 = true;
        if (bVar1 != 0x66) {
          return 0;
        }
      }
    }
    else if (bVar1 == 0x6c) {
      if (frame == (cTValue *)0x0) {
        BVar6 = -1;
      }
      else {
        BVar6 = lj_debug_frameline(L,unaff_R15,nextframe);
      }
      ar->currentline = BVar6;
    }
    else if (bVar1 == 0x6e) {
      if (frame == (cTValue *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        pcVar8 = lj_debug_funcname(L,frame,&ar->name);
      }
      ar->namewhat = pcVar8;
      if (pcVar8 == (char *)0x0) {
        ar->namewhat = "";
        ar->name = (char *)0x0;
      }
    }
    else {
      if (bVar1 != 0x75) {
        return 0;
      }
      ar->nups = (uint)(unaff_R15->c).nupvalues;
      if (ext != 0) {
        if ((unaff_R15->c).ffid == '\0') {
          uVar15 = (ulong)(unaff_R15->c).pc.ptr32;
          ar->nparams = (uint)*(byte *)(uVar15 - 0x3a);
          ar->isvararg = *(byte *)(uVar15 - 0x1b) >> 1 & 1;
        }
        else {
          ar->nparams = 0;
          ar->isvararg = 1;
        }
      }
    }
    what = (char *)((byte *)what + 1);
  } while( true );
}

Assistant:

int lj_debug_getinfo(lua_State *L, const char *what, lj_Debug *ar, int ext)
{
  int opt_f = 0, opt_L = 0;
  TValue *frame = NULL;
  TValue *nextframe = NULL;
  GCfunc *fn;
  if (*what == '>') {
    TValue *func = L->top - 1;
    if (!tvisfunc(func)) return 0;
    fn = funcV(func);
    L->top--;
    what++;
  } else {
    uint32_t offset = (uint32_t)ar->i_ci & 0xffff;
    uint32_t size = (uint32_t)ar->i_ci >> 16;
    lj_assertL(offset != 0, "bad frame offset");
    frame = tvref(L->stack) + offset;
    if (size) nextframe = frame + size;
    lj_assertL(frame <= tvref(L->maxstack) &&
	       (!nextframe || nextframe <= tvref(L->maxstack)),
	       "broken frame chain");
    fn = frame_func(frame);
    lj_assertL(fn->c.gct == ~LJ_TFUNC, "bad frame function");
  }
  for (; *what; what++) {
    if (*what == 'S') {
      if (isluafunc(fn)) {
	GCproto *pt = funcproto(fn);
	BCLine firstline = pt->firstline;
	GCstr *name = proto_chunkname(pt);
	ar->source = strdata(name);
	lj_debug_shortname(ar->short_src, name, pt->firstline);
	ar->linedefined = (int)firstline;
	ar->lastlinedefined = (int)(firstline + pt->numline);
	ar->what = (firstline || !pt->numline) ? "Lua" : "main";
      } else {
	ar->source = "=[C]";
	ar->short_src[0] = '[';
	ar->short_src[1] = 'C';
	ar->short_src[2] = ']';
	ar->short_src[3] = '\0';
	ar->linedefined = -1;
	ar->lastlinedefined = -1;
	ar->what = "C";
      }
    } else if (*what == 'l') {
      ar->currentline = frame ? lj_debug_frameline(L, fn, nextframe) : -1;
    } else if (*what == 'u') {
      ar->nups = fn->c.nupvalues;
      if (ext) {
	if (isluafunc(fn)) {
	  GCproto *pt = funcproto(fn);
	  ar->nparams = pt->numparams;
	  ar->isvararg = !!(pt->flags & PROTO_VARARG);
	} else {
	  ar->nparams = 0;
	  ar->isvararg = 1;
	}
      }
    } else if (*what == 'n') {
      ar->namewhat = frame ? lj_debug_funcname(L, frame, &ar->name) : NULL;
      if (ar->namewhat == NULL) {
	ar->namewhat = "";
	ar->name = NULL;
      }
    } else if (*what == 'f') {
      opt_f = 1;
    } else if (*what == 'L') {
      opt_L = 1;
    } else {
      return 0;  /* Bad option. */
    }
  }
  if (opt_f) {
    setfuncV(L, L->top, fn);
    incr_top(L);
  }
  if (opt_L) {
    if (isluafunc(fn)) {
      GCtab *t = lj_tab_new(L, 0, 0);
      GCproto *pt = funcproto(fn);
      const void *lineinfo = proto_lineinfo(pt);
      if (lineinfo) {
	BCLine first = pt->firstline;
	int sz = pt->numline < 256 ? 1 : pt->numline < 65536 ? 2 : 4;
	MSize i, szl = pt->sizebc-1;
	for (i = 0; i < szl; i++) {
	  BCLine line = first +
	    (sz == 1 ? (BCLine)((const uint8_t *)lineinfo)[i] :
	     sz == 2 ? (BCLine)((const uint16_t *)lineinfo)[i] :
	     (BCLine)((const uint32_t *)lineinfo)[i]);
	  setboolV(lj_tab_setint(L, t, line), 1);
	}
      }
      settabV(L, L->top, t);
    } else {
      setnilV(L->top);
    }
    incr_top(L);
  }
  return 1;  /* Ok. */
}